

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

Cluster * __thiscall mkvparser::Segment::GetLast(Segment *this)

{
  Cluster *pCluster;
  long idx;
  Segment *this_local;
  
  if ((this->m_clusters == (Cluster **)0x0) || (this->m_clusterCount < 1)) {
    this_local = (Segment *)&this->m_eos;
  }
  else {
    this_local = (Segment *)this->m_clusters[this->m_clusterCount + -1];
    if (this_local == (Segment *)0x0) {
      __assert_fail("pCluster",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x9d6,"const Cluster *mkvparser::Segment::GetLast() const");
    }
  }
  return (Cluster *)this_local;
}

Assistant:

const Cluster* Segment::GetLast() const {
  if ((m_clusters == NULL) || (m_clusterCount <= 0))
    return &m_eos;

  const long idx = m_clusterCount - 1;

  Cluster* const pCluster = m_clusters[idx];
  assert(pCluster);

  return pCluster;
}